

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void BinarySink_put_epoint(BinarySink *bs,EdwardsPoint *point,ec_curve *curve,_Bool bare)

{
  BinarySink *pBVar1;
  uint8_t val;
  byte bVar2;
  uint uVar3;
  ulong local_40;
  size_t i;
  mp_int *y;
  mp_int *x;
  ec_curve *peStack_20;
  _Bool bare_local;
  ec_curve *curve_local;
  EdwardsPoint *point_local;
  BinarySink *bs_local;
  
  x._7_1_ = bare;
  peStack_20 = curve;
  curve_local = (ec_curve *)point;
  point_local = (EdwardsPoint *)bs;
  ecc_edwards_get_affine(point,&y,(mp_int **)&i);
  if (1 < peStack_20->fieldBytes) {
    if ((x._7_1_ & 1) == 0) {
      BinarySink_put_uint32((BinarySink *)point_local->Z,peStack_20->fieldBytes);
    }
    for (local_40 = 0; local_40 < peStack_20->fieldBytes - 1; local_40 = local_40 + 1) {
      pBVar1 = (BinarySink *)point_local->Z;
      val = mp_get_byte((mp_int *)i,local_40);
      BinarySink_put_byte(pBVar1,val);
    }
    pBVar1 = (BinarySink *)point_local->Z;
    bVar2 = mp_get_byte((mp_int *)i,peStack_20->fieldBytes - 1);
    uVar3 = mp_get_bit(y,0);
    BinarySink_put_byte(pBVar1,bVar2 & 0x7f | (byte)(uVar3 << 7));
    mp_free(y);
    mp_free((mp_int *)i);
    return;
  }
  __assert_fail("curve->fieldBytes >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x23e,
                "void BinarySink_put_epoint(BinarySink *, EdwardsPoint *, const struct ec_curve *, _Bool)"
               );
}

Assistant:

static void BinarySink_put_epoint(
    BinarySink *bs, EdwardsPoint *point, const struct ec_curve *curve,
    bool bare)
{
    mp_int *x, *y;
    ecc_edwards_get_affine(point, &x, &y);

    assert(curve->fieldBytes >= 2);

    /*
     * EdDSA requires point compression. We store a single integer,
     * with bytes in little-endian order, which mostly contains y but
     * in which the topmost bit is the low bit of x.
     */
    if (!bare)
        put_uint32(bs, curve->fieldBytes);   /* string length field */
    for (size_t i = 0; i < curve->fieldBytes - 1; i++)
        put_byte(bs, mp_get_byte(y, i));
    put_byte(bs, (mp_get_byte(y, curve->fieldBytes - 1) & 0x7F) |
             (mp_get_bit(x, 0) << 7));

    mp_free(x);
    mp_free(y);
}